

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O1

void tif_13uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  int needed;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  byte *pbVar19;
  byte *pbVar20;
  
  if ((length & 0xfffffffffffffff8) == 0) {
    uVar15 = 0;
  }
  else {
    uVar15 = 0;
    do {
      bVar1 = pSrc[1];
      bVar2 = pSrc[2];
      bVar3 = pSrc[3];
      bVar4 = pSrc[4];
      bVar5 = pSrc[5];
      bVar6 = pSrc[6];
      bVar7 = pSrc[7];
      bVar8 = pSrc[8];
      bVar9 = pSrc[9];
      bVar10 = pSrc[10];
      bVar11 = pSrc[0xb];
      bVar12 = pSrc[0xc];
      pDst[uVar15] = (uint)(bVar1 >> 3) | (uint)*pSrc << 5;
      pDst[uVar15 + 1] = (uint)(bVar3 >> 6) | (bVar1 & 7) * 0x400 + (uint)bVar2 * 4;
      pDst[uVar15 + 2] = (uint)(bVar4 >> 1) | (bVar3 & 0x3f) << 7;
      pDst[uVar15 + 3] = (uint)(bVar6 >> 4) | (uint)bVar5 << 4 | (bVar4 & 1) << 0xc;
      pDst[uVar15 + 4] = (uint)(bVar8 >> 7) | (bVar6 & 0xf) * 0x200 + (uint)bVar7 * 2;
      pDst[uVar15 + 5] = (uint)(bVar9 >> 2) | (bVar8 & 0x7f) << 6;
      pDst[uVar15 + 6] = (uint)(bVar11 >> 5) | (bVar9 & 3) * 0x800 + (uint)bVar10 * 8;
      pDst[uVar15 + 7] = (bVar11 & 0x1f) << 8 | (uint)bVar12;
      pSrc = pSrc + 0xd;
      uVar15 = uVar15 + 8;
    } while (uVar15 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    uVar16 = (uint)pSrc[1];
    pDst[uVar15] = (uint)(pSrc[1] >> 3) | (uint)*pSrc << 5;
    uVar18 = (uint)(length & 7);
    if (uVar18 != 1) {
      iVar13 = 3;
      iVar14 = 0xd;
      uVar17 = 0;
      pbVar20 = pSrc + 2;
      do {
        pbVar19 = pbVar20;
        iVar14 = iVar14 - iVar13;
        bVar1 = (byte)iVar14 & 0x1f;
        uVar17 = (uVar17 | ~(-1 << (sbyte)iVar13) & uVar16) << bVar1;
        uVar16 = (uint)*pbVar19;
        pbVar20 = pbVar19 + 1;
        iVar13 = 8;
      } while (8 < iVar14);
      iVar13 = 8 - iVar14;
      pDst[uVar15 + 1] =
           ~(-1 << ((byte)iVar14 & 0x1f)) & (uint)(*pbVar19 >> ((byte)iVar13 & 0x1f)) | uVar17;
      if (2 < uVar18) {
        if (iVar14 == 8) {
          uVar16 = (uint)*pbVar20;
          pbVar20 = pbVar19 + 2;
          iVar13 = 8;
        }
        if (iVar13 < 0xd) {
          iVar14 = 0xd;
          uVar17 = 0;
          do {
            iVar14 = iVar14 - iVar13;
            uVar17 = (~(-1 << ((byte)iVar13 & 0x1f)) & uVar16 | uVar17) << ((byte)iVar14 & 0x1f);
            uVar16 = (uint)*pbVar20;
            pbVar20 = pbVar20 + 1;
            iVar13 = 8;
          } while (8 < iVar14);
        }
        else {
          uVar17 = 0 << bVar1;
          iVar14 = 0xd;
        }
        iVar13 = iVar13 - iVar14;
        pDst[uVar15 + 2] = ~(-1 << ((byte)iVar14 & 0x1f)) & uVar16 >> ((byte)iVar13 & 0x1f) | uVar17
        ;
        if (uVar18 != 3) {
          if (iVar13 == 0) {
            uVar16 = (uint)*pbVar20;
            pbVar20 = pbVar20 + 1;
            iVar13 = 8;
          }
          if (iVar13 < 0xd) {
            iVar14 = 0xd;
            uVar17 = 0;
            do {
              iVar14 = iVar14 - iVar13;
              uVar17 = (~(-1 << ((byte)iVar13 & 0x1f)) & uVar16 | uVar17) << ((byte)iVar14 & 0x1f);
              uVar16 = (uint)*pbVar20;
              pbVar20 = pbVar20 + 1;
              iVar13 = 8;
            } while (8 < iVar14);
          }
          else {
            uVar17 = 0;
            iVar14 = 0xd;
          }
          iVar13 = iVar13 - iVar14;
          pDst[uVar15 + 3] =
               ~(-1 << ((byte)iVar14 & 0x1f)) & uVar16 >> ((byte)iVar13 & 0x1f) | uVar17;
          if (4 < uVar18) {
            if (iVar13 == 0) {
              uVar16 = (uint)*pbVar20;
              pbVar20 = pbVar20 + 1;
              iVar13 = 8;
            }
            if (iVar13 < 0xd) {
              iVar14 = 0xd;
              uVar17 = 0;
              do {
                iVar14 = iVar14 - iVar13;
                uVar17 = (~(-1 << ((byte)iVar13 & 0x1f)) & uVar16 | uVar17) << ((byte)iVar14 & 0x1f)
                ;
                uVar16 = (uint)*pbVar20;
                pbVar20 = pbVar20 + 1;
                iVar13 = 8;
              } while (8 < iVar14);
            }
            else {
              uVar17 = 0;
              iVar14 = 0xd;
            }
            iVar13 = iVar13 - iVar14;
            pDst[uVar15 + 4] =
                 ~(-1 << ((byte)iVar14 & 0x1f)) & uVar16 >> ((byte)iVar13 & 0x1f) | uVar17;
            if (uVar18 != 5) {
              if (iVar13 == 0) {
                uVar16 = (uint)*pbVar20;
                pbVar20 = pbVar20 + 1;
                iVar13 = 8;
              }
              if (iVar13 < 0xd) {
                iVar14 = 0xd;
                uVar17 = 0;
                do {
                  iVar14 = iVar14 - iVar13;
                  uVar17 = (~(-1 << ((byte)iVar13 & 0x1f)) & uVar16 | uVar17) <<
                           ((byte)iVar14 & 0x1f);
                  uVar16 = (uint)*pbVar20;
                  pbVar20 = pbVar20 + 1;
                  iVar13 = 8;
                } while (8 < iVar14);
              }
              else {
                uVar17 = 0;
                iVar14 = 0xd;
              }
              iVar13 = iVar13 - iVar14;
              pDst[uVar15 + 5] =
                   ~(-1 << ((byte)iVar14 & 0x1f)) & uVar16 >> ((byte)iVar13 & 0x1f) | uVar17;
              if (uVar18 == 7) {
                if (iVar13 == 0) {
                  uVar16 = (uint)*pbVar20;
                  pbVar20 = pbVar20 + 1;
                  iVar13 = 8;
                }
                if (iVar13 < 0xd) {
                  iVar14 = 0xd;
                  uVar18 = 0;
                  do {
                    iVar14 = iVar14 - iVar13;
                    uVar18 = (~(-1 << ((byte)iVar13 & 0x1f)) & uVar16 | uVar18) <<
                             ((byte)iVar14 & 0x1f);
                    uVar16 = (uint)*pbVar20;
                    pbVar20 = pbVar20 + 1;
                    iVar13 = 8;
                  } while (8 < iVar14);
                }
                else {
                  uVar18 = 0;
                  iVar14 = 0xd;
                }
                pDst[uVar15 + 6] =
                     ~(-1 << ((byte)iVar14 & 0x1f)) & uVar16 >> ((char)iVar13 - (byte)iVar14 & 0x1f)
                     | uVar18;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_13uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                         OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;
        OPJ_UINT32 val5 = *pSrc++;
        OPJ_UINT32 val6 = *pSrc++;
        OPJ_UINT32 val7 = *pSrc++;
        OPJ_UINT32 val8 = *pSrc++;
        OPJ_UINT32 val9 = *pSrc++;
        OPJ_UINT32 val10 = *pSrc++;
        OPJ_UINT32 val11 = *pSrc++;
        OPJ_UINT32 val12 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 << 5) | (val1 >> 3));
        pDst[i + 1] = (OPJ_INT32)(((val1 & 0x7U) << 10) | (val2 << 2) | (val3 >> 6));
        pDst[i + 2] = (OPJ_INT32)(((val3 & 0x3FU) << 7) | (val4 >> 1));
        pDst[i + 3] = (OPJ_INT32)(((val4 & 0x1U) << 12) | (val5 << 4) | (val6 >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val6 & 0xFU) << 9) | (val7 << 1) | (val8 >> 7));
        pDst[i + 5] = (OPJ_INT32)(((val8 & 0x7FU) << 6) | (val9 >> 2));
        pDst[i + 6] = (OPJ_INT32)(((val9 & 0x3U) << 11) | (val10 << 3) | (val11 >> 5));
        pDst[i + 7] = (OPJ_INT32)(((val11 & 0x1FU) << 8) | (val12));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 13)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 13)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 13)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 13)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 13)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 13)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 13)
                            }
                        }
                    }
                }
            }
        }
    }
}